

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode N_VWrmsNormVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,sunrealtype *nrm)

{
  long lVar1;
  long lVar2;
  sunrealtype *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  sunrealtype sVar3;
  sunrealtype *xd;
  sunrealtype *wd;
  sunindextype N;
  sunindextype j;
  int i;
  SUNContext_conflict sunctx_local_scope_;
  sunrealtype local_58;
  N_Vector in_stack_ffffffffffffffc0;
  long lVar4;
  long local_38;
  int local_2c;
  
  if (in_EDI == 1) {
    sVar3 = N_VWrmsNorm_Serial(in_stack_ffffffffffffffc0,(N_Vector)0x0);
    *in_RCX = sVar3;
  }
  else {
    lVar4 = **(long **)*in_RSI;
    for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
      lVar1 = *(long *)(*(long *)in_RSI[local_2c] + 0x10);
      lVar2 = *(long *)(**(long **)(in_RDX + (long)local_2c * 8) + 0x10);
      in_RCX[local_2c] = 0.0;
      for (local_38 = 0; local_38 < lVar4; local_38 = local_38 + 1) {
        in_RCX[local_2c] =
             *(double *)(lVar1 + local_38 * 8) * *(double *)(lVar2 + local_38 * 8) *
             *(double *)(lVar1 + local_38 * 8) * *(double *)(lVar2 + local_38 * 8) +
             in_RCX[local_2c];
      }
      if (0.0 < in_RCX[local_2c] / (double)lVar4) {
        local_58 = sqrt(in_RCX[local_2c] / (double)lVar4);
      }
      else {
        local_58 = 0.0;
      }
      in_RCX[local_2c] = local_58;
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VWrmsNormVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                         sunrealtype* nrm)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* wd = NULL;
  sunrealtype* xd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VWrmsNorm */
  if (nvec == 1)
  {
    nrm[0] = N_VWrmsNorm_Serial(X[0], W[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /* compute the WRMS norm for each vector in the vector array */
  for (i = 0; i < nvec; i++)
  {
    xd     = NV_DATA_S(X[i]);
    wd     = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j = 0; j < N; j++) { nrm[i] += SUNSQR(xd[j] * wd[j]); }
    nrm[i] = SUNRsqrt(nrm[i] / N);
  }

  return SUN_SUCCESS;
}